

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_framing.c
# Opt level: O0

int amqp_decode_properties(uint16_t class_id,amqp_pool_t *pool,amqp_bytes_t encoded,void **decoded)

{
  amqp_bytes_t encoded_00;
  amqp_bytes_t encoded_01;
  amqp_bytes_t encoded_02;
  amqp_bytes_t encoded_03;
  amqp_bytes_t encoded_04;
  amqp_bytes_t encoded_05;
  amqp_bytes_t encoded_06;
  amqp_bytes_t encoded_07;
  amqp_bytes_t encoded_08;
  amqp_bytes_t encoded_09;
  amqp_bytes_t encoded_10;
  amqp_bytes_t encoded_11;
  amqp_bytes_t encoded_12;
  amqp_bytes_t encoded_13;
  amqp_bytes_t encoded_14;
  amqp_bytes_t encoded_15;
  amqp_bytes_t encoded_16;
  amqp_bytes_t encoded_17;
  amqp_bytes_t encoded_18;
  amqp_bytes_t encoded_19;
  amqp_bytes_t encoded_20;
  amqp_bytes_t encoded_21;
  amqp_bytes_t encoded_22;
  amqp_bytes_t encoded_23;
  amqp_bytes_t encoded_24;
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  ushort in_DI;
  undefined8 *in_R8;
  amqp_confirm_properties_t *p_7;
  amqp_tx_properties_t *p_6;
  uint8_t len_9;
  uint8_t len_8;
  uint8_t len_7;
  uint8_t len_6;
  uint8_t len_5;
  uint8_t len_4;
  uint8_t len_3;
  uint8_t len_2;
  int res;
  uint8_t len_1;
  uint8_t len;
  amqp_basic_properties_t *p_5;
  amqp_queue_properties_t *p_4;
  amqp_exchange_properties_t *p_3;
  amqp_access_properties_t *p_2;
  amqp_channel_properties_t *p_1;
  amqp_connection_properties_t *p;
  uint16_t partial_flags;
  int flagword_index;
  amqp_flags_t flags;
  size_t offset;
  amqp_table_t *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  amqp_pool_t *in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  void *in_stack_ffffffffffffff78;
  ushort local_42;
  uint local_3c;
  int local_4;
  
  local_3c = 0;
  bVar1 = 0;
  do {
    encoded_01.bytes = in_stack_ffffffffffffff78;
    encoded_01.len = (size_t)in_stack_ffffffffffffff70;
    iVar2 = amqp_decode_16(encoded_01,&in_stack_ffffffffffffff68->pagesize,
                           (uint16_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                          );
    if (iVar2 == 0) {
      return -2;
    }
    local_3c = (uint)local_42 << ((bVar1 & 1) << 4) | local_3c;
    bVar1 = bVar1 + 1;
  } while ((local_42 & 1) != 0);
  uVar3 = (uint)in_DI;
  if (uVar3 == 10) {
    puVar4 = (uint *)amqp_pool_alloc(in_stack_ffffffffffffff68,
                                     (ulong)CONCAT24(in_DI,in_stack_ffffffffffffff60));
    if (puVar4 == (uint *)0x0) {
      local_4 = -1;
    }
    else {
      *puVar4 = local_3c;
      *in_R8 = puVar4;
      local_4 = 0;
    }
  }
  else if (uVar3 == 0x14) {
    puVar4 = (uint *)amqp_pool_alloc(in_stack_ffffffffffffff68,
                                     (ulong)CONCAT24(in_DI,in_stack_ffffffffffffff60));
    if (puVar4 == (uint *)0x0) {
      local_4 = -1;
    }
    else {
      *puVar4 = local_3c;
      *in_R8 = puVar4;
      local_4 = 0;
    }
  }
  else if (uVar3 == 0x1e) {
    puVar4 = (uint *)amqp_pool_alloc(in_stack_ffffffffffffff68,
                                     (ulong)CONCAT24(in_DI,in_stack_ffffffffffffff60));
    if (puVar4 == (uint *)0x0) {
      local_4 = -1;
    }
    else {
      *puVar4 = local_3c;
      *in_R8 = puVar4;
      local_4 = 0;
    }
  }
  else if (uVar3 == 0x28) {
    puVar4 = (uint *)amqp_pool_alloc(in_stack_ffffffffffffff68,
                                     (ulong)CONCAT24(in_DI,in_stack_ffffffffffffff60));
    if (puVar4 == (uint *)0x0) {
      local_4 = -1;
    }
    else {
      *puVar4 = local_3c;
      *in_R8 = puVar4;
      local_4 = 0;
    }
  }
  else if (uVar3 == 0x32) {
    puVar4 = (uint *)amqp_pool_alloc(in_stack_ffffffffffffff68,
                                     (ulong)CONCAT24(in_DI,in_stack_ffffffffffffff60));
    if (puVar4 == (uint *)0x0) {
      local_4 = -1;
    }
    else {
      *puVar4 = local_3c;
      *in_R8 = puVar4;
      local_4 = 0;
    }
  }
  else if (uVar3 == 0x3c) {
    puVar4 = (uint *)amqp_pool_alloc(in_stack_ffffffffffffff68,
                                     (ulong)CONCAT24(in_DI,in_stack_ffffffffffffff60));
    if (puVar4 == (uint *)0x0) {
      local_4 = -1;
    }
    else {
      *puVar4 = local_3c;
      if (((local_3c & 0x8000) == 0) ||
         ((encoded_02.bytes = in_stack_ffffffffffffff78,
          encoded_02.len = (size_t)in_stack_ffffffffffffff70,
          iVar2 = amqp_decode_8(encoded_02,&in_stack_ffffffffffffff68->pagesize,
                                (uint8_t *)CONCAT44(uVar3,in_stack_ffffffffffffff60)), iVar2 != 0 &&
          (encoded_03.bytes = in_stack_ffffffffffffff78,
          encoded_03.len = (size_t)in_stack_ffffffffffffff70,
          iVar2 = amqp_decode_bytes(encoded_03,&in_stack_ffffffffffffff68->pagesize,
                                    (amqp_bytes_t *)CONCAT44(uVar3,in_stack_ffffffffffffff60),
                                    (size_t)in_stack_ffffffffffffff58), iVar2 != 0)))) {
        if (((local_3c & 0x4000) == 0) ||
           ((encoded_04.bytes = in_stack_ffffffffffffff78,
            encoded_04.len = (size_t)in_stack_ffffffffffffff70,
            iVar2 = amqp_decode_8(encoded_04,&in_stack_ffffffffffffff68->pagesize,
                                  (uint8_t *)CONCAT44(uVar3,in_stack_ffffffffffffff60)), iVar2 != 0
            && (encoded_05.bytes = in_stack_ffffffffffffff78,
               encoded_05.len = (size_t)in_stack_ffffffffffffff70,
               iVar2 = amqp_decode_bytes(encoded_05,&in_stack_ffffffffffffff68->pagesize,
                                         (amqp_bytes_t *)CONCAT44(uVar3,in_stack_ffffffffffffff60),
                                         (size_t)in_stack_ffffffffffffff58), iVar2 != 0)))) {
          if (((local_3c & 0x2000) == 0) ||
             (encoded_00.bytes = in_stack_ffffffffffffff70,
             encoded_00.len = (size_t)in_stack_ffffffffffffff68,
             local_4 = amqp_decode_table(encoded_00,
                                         (amqp_pool_t *)CONCAT44(uVar3,in_stack_ffffffffffffff60),
                                         in_stack_ffffffffffffff58,(size_t *)0x110d67), -1 < local_4
             )) {
            if (((local_3c & 0x1000) == 0) ||
               (encoded_06.bytes = in_stack_ffffffffffffff78,
               encoded_06.len = (size_t)in_stack_ffffffffffffff70,
               iVar2 = amqp_decode_8(encoded_06,&in_stack_ffffffffffffff68->pagesize,
                                     (uint8_t *)CONCAT44(uVar3,in_stack_ffffffffffffff60)),
               iVar2 != 0)) {
              if (((local_3c & 0x800) == 0) ||
                 (encoded_07.bytes = in_stack_ffffffffffffff78,
                 encoded_07.len = (size_t)in_stack_ffffffffffffff70,
                 iVar2 = amqp_decode_8(encoded_07,&in_stack_ffffffffffffff68->pagesize,
                                       (uint8_t *)CONCAT44(uVar3,in_stack_ffffffffffffff60)),
                 iVar2 != 0)) {
                if (((local_3c & 0x400) == 0) ||
                   ((encoded_08.bytes = in_stack_ffffffffffffff78,
                    encoded_08.len = (size_t)in_stack_ffffffffffffff70,
                    iVar2 = amqp_decode_8(encoded_08,&in_stack_ffffffffffffff68->pagesize,
                                          (uint8_t *)CONCAT44(uVar3,in_stack_ffffffffffffff60)),
                    iVar2 != 0 &&
                    (encoded_09.bytes = in_stack_ffffffffffffff78,
                    encoded_09.len = (size_t)in_stack_ffffffffffffff70,
                    iVar2 = amqp_decode_bytes(encoded_09,&in_stack_ffffffffffffff68->pagesize,
                                              (amqp_bytes_t *)
                                              CONCAT44(uVar3,in_stack_ffffffffffffff60),
                                              (size_t)in_stack_ffffffffffffff58), iVar2 != 0)))) {
                  if (((local_3c & 0x200) == 0) ||
                     ((encoded_10.bytes = in_stack_ffffffffffffff78,
                      encoded_10.len = (size_t)in_stack_ffffffffffffff70,
                      iVar2 = amqp_decode_8(encoded_10,&in_stack_ffffffffffffff68->pagesize,
                                            (uint8_t *)CONCAT44(uVar3,in_stack_ffffffffffffff60)),
                      iVar2 != 0 &&
                      (encoded_11.bytes = in_stack_ffffffffffffff78,
                      encoded_11.len = (size_t)in_stack_ffffffffffffff70,
                      iVar2 = amqp_decode_bytes(encoded_11,&in_stack_ffffffffffffff68->pagesize,
                                                (amqp_bytes_t *)
                                                CONCAT44(uVar3,in_stack_ffffffffffffff60),
                                                (size_t)in_stack_ffffffffffffff58), iVar2 != 0)))) {
                    if (((local_3c & 0x100) == 0) ||
                       ((encoded_12.bytes = in_stack_ffffffffffffff78,
                        encoded_12.len = (size_t)in_stack_ffffffffffffff70,
                        iVar2 = amqp_decode_8(encoded_12,&in_stack_ffffffffffffff68->pagesize,
                                              (uint8_t *)CONCAT44(uVar3,in_stack_ffffffffffffff60)),
                        iVar2 != 0 &&
                        (encoded_13.bytes = in_stack_ffffffffffffff78,
                        encoded_13.len = (size_t)in_stack_ffffffffffffff70,
                        iVar2 = amqp_decode_bytes(encoded_13,&in_stack_ffffffffffffff68->pagesize,
                                                  (amqp_bytes_t *)
                                                  CONCAT44(uVar3,in_stack_ffffffffffffff60),
                                                  (size_t)in_stack_ffffffffffffff58), iVar2 != 0))))
                    {
                      if (((local_3c & 0x80) == 0) ||
                         ((encoded_14.bytes = in_stack_ffffffffffffff78,
                          encoded_14.len = (size_t)in_stack_ffffffffffffff70,
                          iVar2 = amqp_decode_8(encoded_14,&in_stack_ffffffffffffff68->pagesize,
                                                (uint8_t *)CONCAT44(uVar3,in_stack_ffffffffffffff60)
                                               ), iVar2 != 0 &&
                          (encoded_15.bytes = in_stack_ffffffffffffff78,
                          encoded_15.len = (size_t)in_stack_ffffffffffffff70,
                          iVar2 = amqp_decode_bytes(encoded_15,&in_stack_ffffffffffffff68->pagesize,
                                                    (amqp_bytes_t *)
                                                    CONCAT44(uVar3,in_stack_ffffffffffffff60),
                                                    (size_t)in_stack_ffffffffffffff58), iVar2 != 0))
                         )) {
                        if (((local_3c & 0x40) == 0) ||
                           (encoded_16.bytes = in_stack_ffffffffffffff78,
                           encoded_16.len = (size_t)in_stack_ffffffffffffff70,
                           iVar2 = amqp_decode_64(encoded_16,&in_stack_ffffffffffffff68->pagesize,
                                                  (uint64_t *)
                                                  CONCAT44(uVar3,in_stack_ffffffffffffff60)),
                           iVar2 != 0)) {
                          if (((local_3c & 0x20) == 0) ||
                             ((encoded_17.bytes = in_stack_ffffffffffffff78,
                              encoded_17.len = (size_t)in_stack_ffffffffffffff70,
                              iVar2 = amqp_decode_8(encoded_17,&in_stack_ffffffffffffff68->pagesize,
                                                    (uint8_t *)
                                                    CONCAT44(uVar3,in_stack_ffffffffffffff60)),
                              iVar2 != 0 &&
                              (encoded_18.bytes = in_stack_ffffffffffffff78,
                              encoded_18.len = (size_t)in_stack_ffffffffffffff70,
                              iVar2 = amqp_decode_bytes(encoded_18,
                                                        &in_stack_ffffffffffffff68->pagesize,
                                                        (amqp_bytes_t *)
                                                        CONCAT44(uVar3,in_stack_ffffffffffffff60),
                                                        (size_t)in_stack_ffffffffffffff58),
                              iVar2 != 0)))) {
                            if (((local_3c & 0x10) == 0) ||
                               ((encoded_19.bytes = in_stack_ffffffffffffff78,
                                encoded_19.len = (size_t)in_stack_ffffffffffffff70,
                                iVar2 = amqp_decode_8(encoded_19,
                                                      &in_stack_ffffffffffffff68->pagesize,
                                                      (uint8_t *)
                                                      CONCAT44(uVar3,in_stack_ffffffffffffff60)),
                                iVar2 != 0 &&
                                (encoded_20.bytes = in_stack_ffffffffffffff78,
                                encoded_20.len = (size_t)in_stack_ffffffffffffff70,
                                iVar2 = amqp_decode_bytes(encoded_20,
                                                          &in_stack_ffffffffffffff68->pagesize,
                                                          (amqp_bytes_t *)
                                                          CONCAT44(uVar3,in_stack_ffffffffffffff60),
                                                          (size_t)in_stack_ffffffffffffff58),
                                iVar2 != 0)))) {
                              if (((local_3c & 8) == 0) ||
                                 ((encoded_21.bytes = in_stack_ffffffffffffff78,
                                  encoded_21.len = (size_t)in_stack_ffffffffffffff70,
                                  iVar2 = amqp_decode_8(encoded_21,
                                                        &in_stack_ffffffffffffff68->pagesize,
                                                        (uint8_t *)
                                                        CONCAT44(uVar3,in_stack_ffffffffffffff60)),
                                  iVar2 != 0 &&
                                  (encoded_22.bytes = in_stack_ffffffffffffff78,
                                  encoded_22.len = (size_t)in_stack_ffffffffffffff70,
                                  iVar2 = amqp_decode_bytes(encoded_22,
                                                            &in_stack_ffffffffffffff68->pagesize,
                                                            (amqp_bytes_t *)
                                                            CONCAT44(uVar3,in_stack_ffffffffffffff60
                                                                    ),
                                                            (size_t)in_stack_ffffffffffffff58),
                                  iVar2 != 0)))) {
                                if (((local_3c & 4) == 0) ||
                                   ((encoded_23.bytes = in_stack_ffffffffffffff78,
                                    encoded_23.len = (size_t)in_stack_ffffffffffffff70,
                                    iVar2 = amqp_decode_8(encoded_23,
                                                          &in_stack_ffffffffffffff68->pagesize,
                                                          (uint8_t *)
                                                          CONCAT44(uVar3,in_stack_ffffffffffffff60))
                                    , iVar2 != 0 &&
                                    (encoded_24.bytes = in_stack_ffffffffffffff78,
                                    encoded_24.len = (size_t)in_stack_ffffffffffffff70,
                                    iVar2 = amqp_decode_bytes(encoded_24,
                                                              &in_stack_ffffffffffffff68->pagesize,
                                                              (amqp_bytes_t *)
                                                              CONCAT44(uVar3,
                                                  in_stack_ffffffffffffff60),
                                                  (size_t)in_stack_ffffffffffffff58), iVar2 != 0))))
                                {
                                  *in_R8 = puVar4;
                                  local_4 = 0;
                                }
                                else {
                                  local_4 = -2;
                                }
                              }
                              else {
                                local_4 = -2;
                              }
                            }
                            else {
                              local_4 = -2;
                            }
                          }
                          else {
                            local_4 = -2;
                          }
                        }
                        else {
                          local_4 = -2;
                        }
                      }
                      else {
                        local_4 = -2;
                      }
                    }
                    else {
                      local_4 = -2;
                    }
                  }
                  else {
                    local_4 = -2;
                  }
                }
                else {
                  local_4 = -2;
                }
              }
              else {
                local_4 = -2;
              }
            }
            else {
              local_4 = -2;
            }
          }
        }
        else {
          local_4 = -2;
        }
      }
      else {
        local_4 = -2;
      }
    }
  }
  else if (uVar3 == 0x55) {
    puVar4 = (uint *)amqp_pool_alloc(in_stack_ffffffffffffff68,
                                     (ulong)CONCAT24(in_DI,in_stack_ffffffffffffff60));
    if (puVar4 == (uint *)0x0) {
      local_4 = -1;
    }
    else {
      *puVar4 = local_3c;
      *in_R8 = puVar4;
      local_4 = 0;
    }
  }
  else if (uVar3 == 0x5a) {
    puVar4 = (uint *)amqp_pool_alloc(in_stack_ffffffffffffff68,
                                     (ulong)CONCAT24(in_DI,in_stack_ffffffffffffff60));
    if (puVar4 == (uint *)0x0) {
      local_4 = -1;
    }
    else {
      *puVar4 = local_3c;
      *in_R8 = puVar4;
      local_4 = 0;
    }
  }
  else {
    local_4 = -3;
  }
  return local_4;
}

Assistant:

int amqp_decode_properties(uint16_t class_id, amqp_pool_t *pool,
                           amqp_bytes_t encoded, void **decoded) {
  size_t offset = 0;

  amqp_flags_t flags = 0;
  int flagword_index = 0;
  uint16_t partial_flags;

  do {
    if (!amqp_decode_16(encoded, &offset, &partial_flags))
      return AMQP_STATUS_BAD_AMQP_DATA;
    flags |= (partial_flags << (flagword_index * 16));
    flagword_index++;
  } while (partial_flags & 1);

  switch (class_id) {
    case 10: {
      amqp_connection_properties_t *p =
          (amqp_connection_properties_t *)amqp_pool_alloc(
              pool, sizeof(amqp_connection_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    case 20: {
      amqp_channel_properties_t *p =
          (amqp_channel_properties_t *)amqp_pool_alloc(
              pool, sizeof(amqp_channel_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    case 30: {
      amqp_access_properties_t *p = (amqp_access_properties_t *)amqp_pool_alloc(
          pool, sizeof(amqp_access_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    case 40: {
      amqp_exchange_properties_t *p =
          (amqp_exchange_properties_t *)amqp_pool_alloc(
              pool, sizeof(amqp_exchange_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    case 50: {
      amqp_queue_properties_t *p = (amqp_queue_properties_t *)amqp_pool_alloc(
          pool, sizeof(amqp_queue_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    case 60: {
      amqp_basic_properties_t *p = (amqp_basic_properties_t *)amqp_pool_alloc(
          pool, sizeof(amqp_basic_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      if (flags & AMQP_BASIC_CONTENT_TYPE_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->content_type, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_CONTENT_ENCODING_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->content_encoding, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_HEADERS_FLAG) {
        {
          int res = amqp_decode_table(encoded, pool, &(p->headers), &offset);
          if (res < 0) return res;
        }
      }
      if (flags & AMQP_BASIC_DELIVERY_MODE_FLAG) {
        if (!amqp_decode_8(encoded, &offset, &p->delivery_mode))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_PRIORITY_FLAG) {
        if (!amqp_decode_8(encoded, &offset, &p->priority))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_CORRELATION_ID_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->correlation_id, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_REPLY_TO_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->reply_to, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_EXPIRATION_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->expiration, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_MESSAGE_ID_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->message_id, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_TIMESTAMP_FLAG) {
        if (!amqp_decode_64(encoded, &offset, &p->timestamp))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_TYPE_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->type, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_USER_ID_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->user_id, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_APP_ID_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->app_id, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_CLUSTER_ID_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->cluster_id, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      *decoded = p;
      return 0;
    }
    case 90: {
      amqp_tx_properties_t *p = (amqp_tx_properties_t *)amqp_pool_alloc(
          pool, sizeof(amqp_tx_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    case 85: {
      amqp_confirm_properties_t *p =
          (amqp_confirm_properties_t *)amqp_pool_alloc(
              pool, sizeof(amqp_confirm_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    default:
      return AMQP_STATUS_UNKNOWN_CLASS;
  }
}